

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 gen_lea_mode(CPUM68KState_conflict *env,DisasContext_conflict2 *s,int mode,int reg0,
                     int opsize)

{
  target_ulong_conflict tVar1;
  TCGContext_conflict2 *tcg_ctx_00;
  uint16_t uVar2;
  int iVar3;
  uint32_t val;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  uint32_t offset;
  uint16_t ext;
  TCGv_i32 tmp;
  TCGv_i32 reg;
  TCGContext_conflict2 *tcg_ctx;
  int opsize_local;
  int reg0_local;
  int mode_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  switch(mode) {
  case 0:
  case 1:
    env_local = (CPUM68KState_conflict *)tcg_ctx_00->NULL_QREG;
    break;
  case 3:
    if (opsize == 7) {
      return tcg_ctx_00->NULL_QREG;
    }
  case 2:
    env_local = (CPUM68KState_conflict *)get_areg(s,reg0);
    break;
  case 4:
    if (opsize == 7) {
      env_local = (CPUM68KState_conflict *)tcg_ctx_00->NULL_QREG;
    }
    else {
      pTVar5 = get_areg(s,reg0);
      pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
      env_local = (CPUM68KState_conflict *)mark_to_release(s,pTVar4);
      if (((reg0 == 7) && (opsize == 0)) && (iVar3 = m68k_feature(s->env,0), iVar3 != 0)) {
        tcg_gen_subi_i32_m68k(tcg_ctx_00,(TCGv_i32)env_local,pTVar5,2);
      }
      else {
        iVar3 = opsize_bytes(opsize);
        tcg_gen_subi_i32_m68k(tcg_ctx_00,(TCGv_i32)env_local,pTVar5,iVar3);
      }
    }
    break;
  case 5:
    pTVar5 = get_areg(s,reg0);
    pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
    env_local = (CPUM68KState_conflict *)mark_to_release(s,pTVar4);
    uVar2 = read_im16(env,s);
    tcg_gen_addi_i32_m68k(tcg_ctx_00,(TCGv_i32)env_local,pTVar5,(int)(short)uVar2);
    break;
  case 6:
    pTVar5 = get_areg(s,reg0);
    env_local = (CPUM68KState_conflict *)gen_lea_indexed(env,s,pTVar5);
    break;
  case 7:
    switch(reg0) {
    case 0:
      uVar2 = read_im16(env,s);
      pTVar5 = tcg_const_i32_m68k(tcg_ctx_00,(int)(short)uVar2);
      env_local = (CPUM68KState_conflict *)mark_to_release(s,pTVar5);
      break;
    case 1:
      val = read_im32(env,s);
      pTVar5 = tcg_const_i32_m68k(tcg_ctx_00,val);
      env_local = (CPUM68KState_conflict *)mark_to_release(s,pTVar5);
      break;
    case 2:
      tVar1 = s->pc;
      uVar2 = read_im16(env,s);
      pTVar5 = tcg_const_i32_m68k(tcg_ctx_00,(int)(short)uVar2 + tVar1);
      env_local = (CPUM68KState_conflict *)mark_to_release(s,pTVar5);
      break;
    case 3:
      env_local = (CPUM68KState_conflict *)gen_lea_indexed(env,s,tcg_ctx_00->NULL_QREG);
      break;
    case 4:
    default:
      env_local = (CPUM68KState_conflict *)tcg_ctx_00->NULL_QREG;
    }
    break;
  default:
    env_local = (CPUM68KState_conflict *)tcg_ctx_00->NULL_QREG;
  }
  return (TCGv_i32)env_local;
}

Assistant:

static TCGv gen_lea_mode(CPUM68KState *env, DisasContext *s,
                         int mode, int reg0, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;
    uint16_t ext;
    uint32_t offset;

    switch (mode) {
    case 0: /* Data register direct.  */
    case 1: /* Address register direct.  */
        return tcg_ctx->NULL_QREG;
    case 3: /* Indirect postincrement.  */
        if (opsize == OS_UNSIZED) {
            return tcg_ctx->NULL_QREG;
        }
        /* fallthru */
    case 2: /* Indirect register */
        return get_areg(s, reg0);
    case 4: /* Indirect predecrememnt.  */
        if (opsize == OS_UNSIZED) {
            return tcg_ctx->NULL_QREG;
        }
        reg = get_areg(s, reg0);
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        if (reg0 == 7 && opsize == OS_BYTE &&
            m68k_feature(s->env, M68K_FEATURE_M68000)) {
            tcg_gen_subi_i32(tcg_ctx, tmp, reg, 2);
        } else {
            tcg_gen_subi_i32(tcg_ctx, tmp, reg, opsize_bytes(opsize));
        }
        return tmp;
    case 5: /* Indirect displacement.  */
        reg = get_areg(s, reg0);
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        ext = read_im16(env, s);
        tcg_gen_addi_i32(tcg_ctx, tmp, reg, (int16_t)ext);
        return tmp;
    case 6: /* Indirect index + displacement.  */
        reg = get_areg(s, reg0);
        return gen_lea_indexed(env, s, reg);
    case 7: /* Other */
        switch (reg0) {
        case 0: /* Absolute short.  */
            offset = (int16_t)read_im16(env, s);
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        case 1: /* Absolute long.  */
            offset = read_im32(env, s);
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        case 2: /* pc displacement  */
            offset = s->pc;
            offset += (int16_t)read_im16(env, s);
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        case 3: /* pc index+displacement.  */
            return gen_lea_indexed(env, s, tcg_ctx->NULL_QREG);
        case 4: /* Immediate.  */
        default:
            return tcg_ctx->NULL_QREG;
        }
    }
    /* Should never happen.  */
    return tcg_ctx->NULL_QREG;
}